

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_identity(lysp_yang_ctx *ctx,lysp_ident **identities)

{
  lysp_ext_instance **exts;
  lysp_ident *plVar1;
  long lVar2;
  lyd_node *plVar3;
  LY_ERR LVar4;
  long *plVar5;
  char *pcVar6;
  uint16_t *puVar7;
  lyd_node **word_len_00;
  char *format;
  ly_stmt parent_stmt;
  ly_ctx *plVar8;
  void *parent;
  lysp_ext_instance **exts_00;
  char **str_p;
  uint16_t *puVar9;
  bool bVar10;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  lysp_ext_instance **in_stack_ffffffffffffff80;
  ly_stmt local_74;
  char *local_70;
  lyd_node *local_68;
  uint16_t *local_60;
  lysp_qname **local_58;
  uint16_t *local_50;
  uint16_t *local_48;
  uint16_t *local_40;
  lysp_ext_instance *local_38;
  
  plVar1 = *identities;
  if (plVar1 == (lysp_ident *)0x0) {
    plVar5 = (long *)malloc(0x40);
    if (plVar5 != (long *)0x0) {
      *plVar5 = 1;
      goto LAB_0017d9a7;
    }
  }
  else {
    lVar2 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar2 + 1;
    plVar5 = (long *)realloc(&plVar1[-1].flags,lVar2 * 0x38 + 0x40);
    if (plVar5 != (long *)0x0) {
LAB_0017d9a7:
      *identities = (lysp_ident *)(plVar5 + 1);
      lVar2 = *plVar5;
      plVar5[lVar2 * 7 + -2] = 0;
      (plVar5 + lVar2 * 7 + -2)[1] = 0;
      plVar5[lVar2 * 7 + -4] = 0;
      (plVar5 + lVar2 * 7 + -4)[1] = 0;
      plVar5[lVar2 * 7 + -6] = 0;
      (plVar5 + lVar2 * 7 + -6)[1] = 0;
      plVar5[lVar2 * 7] = 0;
      exts_00 = &local_38;
      LVar4 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_70,(char **)exts_00,
                           (size_t *)&local_68);
      if (LVar4 != LY_SUCCESS) {
        return LVar4 + (LVar4 == LY_SUCCESS);
      }
      str_p = (char **)(plVar5 + lVar2 * 7 + -6);
      if (local_38 == (lysp_ext_instance *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar6 = local_70;
        if (local_68 == (lyd_node *)0x0) {
          pcVar6 = "";
        }
        LVar4 = lydict_insert(plVar8,pcVar6,(size_t)local_68,str_p);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar4 = lydict_insert_zc(plVar8,local_70,str_p);
      }
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      word_len_00 = &local_68;
      LVar4 = get_keyword(ctx,&local_74,&local_70,(size_t *)word_len_00);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      if (local_74 == LY_STMT_SYNTAX_SEMICOLON) {
        bVar10 = true;
      }
      else {
        if (local_74 != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar6 = lyplg_ext_stmt2str(local_74);
          ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar6);
          return LY_EVALID;
        }
        word_len_00 = &local_68;
        LVar4 = get_keyword(ctx,&local_74,&local_70,(size_t *)word_len_00);
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        bVar10 = local_74 == LY_STMT_SYNTAX_RIGHT_BRACE;
      }
      if (bVar10) {
        return LY_SUCCESS;
      }
      puVar9 = (uint16_t *)(plVar5 + lVar2 * 7);
      exts = (lysp_ext_instance **)(puVar9 + -4);
      local_60 = puVar9 + -0x10;
      local_48 = puVar9 + -8;
      local_58 = (lysp_qname **)(puVar9 + -0x14);
      local_50 = puVar9 + -0xc;
      bVar10 = false;
      local_40 = puVar9;
      do {
        if ((int)local_74 < 0x130000) {
          if (local_74 == LY_STMT_BASE) {
            if (*(long *)local_60 != 0) {
              word_len_00 = (ctx->parsed_mods->field_2).dnodes;
              if (*(byte *)&word_len_00[ctx->parsed_mods->count - 1][2].schema < 2) {
                if (ctx == (lysp_yang_ctx *)0x0) {
                  plVar8 = (ly_ctx *)0x0;
                }
                else {
                  plVar8 = (ly_ctx *)**(undefined8 **)word_len_00[ctx->parsed_mods->count - 1];
                }
                ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Identity can be derived from multiple base identities only in YANG 1.1 modules"
                       );
                return LY_EVALID;
              }
            }
            LVar4 = parse_text_fields(ctx,(ly_stmt)local_60,(char ***)exts,(yang_arg)word_len_00,
                                      exts_00);
          }
          else if (local_74 == LY_STMT_DESCRIPTION) {
            parent = *(void **)local_50;
            parent_stmt = LY_STMT_DESCRIPTION;
            puVar7 = local_50;
LAB_0017dc96:
            exts_00 = (lysp_ext_instance **)0x2;
            LVar4 = parse_text_field(ctx,parent,parent_stmt,(uint32_t)puVar7,(char **)0x2,
                                     Y_IDENTIF_ARG,(uint16_t *)exts,in_stack_ffffffffffffff80);
          }
          else {
            if (local_74 != LY_STMT_EXTENSION_INSTANCE) {
LAB_0017dd63:
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar8 = (ly_ctx *)0x0;
              }
              else {
                plVar8 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar6 = lyplg_ext_stmt2str(local_74);
              format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_0017dddd:
              ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"identity");
              return LY_EVALID;
            }
            exts_00 = (lysp_ext_instance **)0x120000;
            LVar4 = parse_ext(ctx,local_70,(size_t)local_68,str_p,LY_STMT_IDENTITY,0,exts);
          }
        }
        else if (local_74 == LY_STMT_IF_FEATURE) {
          plVar3 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          if (*(byte *)&plVar3[2].schema < 2) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar8 = (ly_ctx *)0x0;
            }
            else {
              plVar8 = (ly_ctx *)**(undefined8 **)plVar3;
            }
            format = 
            "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
            ;
            pcVar6 = "if-feature";
            goto LAB_0017dddd;
          }
          LVar4 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_58,(yang_arg)exts,exts_00);
        }
        else {
          if (local_74 == LY_STMT_REFERENCE) {
            parent = *(void **)local_48;
            parent_stmt = LY_STMT_REFERENCE;
            puVar7 = local_48;
            goto LAB_0017dc96;
          }
          if (local_74 != LY_STMT_STATUS) goto LAB_0017dd63;
          LVar4 = parse_status(ctx,local_40,exts);
        }
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        word_len_00 = &local_68;
        LVar4 = get_keyword(ctx,&local_74,&local_70,(size_t *)word_len_00);
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        if (local_74 == LY_STMT_SYNTAX_RIGHT_BRACE) {
          bVar10 = true;
          if (*(void **)(puVar9 + -4) != (void *)0x0) {
            word_len_00 = (lyd_node **)0x0;
            LVar4 = ly_set_add(&ctx->main_ctx->ext_inst,*(void **)(puVar9 + -4),'\x01',
                               (uint32_t *)0x0);
            if (LVar4 != LY_SUCCESS) {
              return LVar4;
            }
          }
        }
        if (bVar10) {
          return LY_SUCCESS;
        }
      } while( true );
    }
    *(long *)&(*identities)[-1].flags = *(long *)&(*identities)[-1].flags + -1;
  }
  if (ctx == (lysp_yang_ctx *)0x0) {
    plVar8 = (ly_ctx *)0x0;
  }
  else {
    plVar8 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_identity");
  return LY_EMEM;
}

Assistant:

LY_ERR
parse_identity(struct lysp_yang_ctx *ctx, struct lysp_ident **identities)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_ident *ident;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *identities, ident, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, ident->name, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, ident->dsc, LY_STMT_DESCRIPTION, 0, &ident->dsc, Y_STR_ARG, NULL, &ident->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", "identity");
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &ident->iffeatures, Y_STR_ARG, &ident->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, ident->ref, LY_STMT_REFERENCE, 0, &ident->ref, Y_STR_ARG, NULL, &ident->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &ident->flags, &ident->exts));
            break;
        case LY_STMT_BASE:
            if (ident->bases && (PARSER_CUR_PMOD(ctx)->version < LYS_VERSION_1_1)) {
                LOGVAL_PARSER(ctx, LYVE_SYNTAX_YANG,
                        "Identity can be derived from multiple base identities only in YANG 1.1 modules");
                return LY_EVALID;
            }
            LY_CHECK_RET(parse_text_fields(ctx, LY_STMT_BASE, &ident->bases, Y_PREF_IDENTIF_ARG, &ident->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, ident, LY_STMT_IDENTITY, 0, &ident->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "identity");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, ident->exts, ret, cleanup);
    }

cleanup:
    return ret;
}